

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.h
# Opt level: O2

void __thiscall units::bad_parser::~bad_parser(bad_parser *this)

{
  ~bad_parser(this);
  operator_delete(this);
  return;
}

Assistant:

bad_parser(const char* msg) : msg_(msg) {}